

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.h
# Opt level: O2

bool __thiscall soul::Type::isValidArrayOrVectorRange<long>(Type *this,long start,long end)

{
  bool bVar1;
  ArraySize AVar2;
  ArraySize AVar3;
  
  bVar1 = isValidArrayOrVectorIndex<long>(this,start);
  if (bVar1) {
    bVar1 = isValidArrayOrVectorIndex<long>(this,end);
    if (!bVar1) {
      AVar2 = getArrayOrVectorSize(this);
      if (AVar2 != end) goto LAB_0020913e;
    }
    AVar2 = convertArrayOrVectorIndexToValidRange<long>(this,start);
    AVar3 = convertArrayOrVectorIndexToValidRange<long>(this,end);
    bVar1 = end != 0 && AVar2 < AVar3;
  }
  else {
LAB_0020913e:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isValidArrayOrVectorRange (IntType start, IntType end) const
    {
        return isValidArrayOrVectorIndex (start)
                && (isValidArrayOrVectorIndex (end) || (ArraySize) end == getArrayOrVectorSize())
                && convertArrayOrVectorIndexToValidRange (start) < convertArrayOrVectorIndexToValidRange (end)
                && end != 0;
    }